

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_comparison_operators(void)

{
  json d3;
  json d2;
  json d1;
  json i3;
  json i2;
  json i1;
  json s3;
  json s2;
  json s1;
  
  argo::json::json(&i1,1);
  argo::json::json(&i2,1);
  argo::json::json(&i3,2);
  std::operator<<((ostream *)jlog,"testing int comparisons\n");
  test_comparison_operators_same(&i1,&i2,&i3);
  argo::json::json(&d1,1.0);
  argo::json::json(&d2,1.0);
  argo::json::json(&d3,2.0);
  std::operator<<((ostream *)jlog,"testing double comparisons\n");
  test_comparison_operators_same(&d1,&d2,&d3);
  argo::json::json(&s1,"a");
  argo::json::json(&s2,"a");
  argo::json::json(&s3,"b");
  std::operator<<((ostream *)jlog,"testing string comparisons\n");
  test_comparison_operators_same(&d1,&d2,&d3);
  std::operator<<((ostream *)jlog,"testing int/double comparisons\n");
  test_comparison_operators_same(&i1,&i2,&i3);
  test_comparison_operators_same(&i1,&i2,&d3);
  test_comparison_operators_same(&i1,&d2,&i3);
  test_comparison_operators_same(&i1,&d2,&d3);
  test_comparison_operators_same(&d1,&i2,&i3);
  test_comparison_operators_same(&d1,&i2,&d3);
  test_comparison_operators_same(&d1,&d2,&i3);
  test_comparison_operators_same(&d1,&d2,&d3);
  argo::json::~json(&s3);
  argo::json::~json(&s2);
  argo::json::~json(&s1);
  argo::json::~json(&d3);
  argo::json::~json(&d2);
  argo::json::~json(&d1);
  argo::json::~json(&i3);
  argo::json::~json(&i2);
  argo::json::~json(&i1);
  return;
}

Assistant:

void test_comparison_operators()
{
    // test < > <= >= == != where both sides are the same type

    json i1(1);
    json i2(1);
    json i3(2);
    jlog << "testing int comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    json d1(1.0);
    json d2(1.0);
    json d3(2.0);
    jlog << "testing double comparisons\n";
    test_comparison_operators_same(d1, d2, d3);
    json s1("a");
    json s2("a");
    json s3("b");
    jlog << "testing string comparisons\n";
    test_comparison_operators_same(d1, d2, d3);

    // test < > <= >= == != where one side is an int and the other is a double
    jlog << "testing int/double comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    test_comparison_operators_same(i1, i2, d3);
    test_comparison_operators_same(i1, d2, i3);
    test_comparison_operators_same(i1, d2, d3);
    test_comparison_operators_same(d1, i2, i3);
    test_comparison_operators_same(d1, i2, d3);
    test_comparison_operators_same(d1, d2, i3);
    test_comparison_operators_same(d1, d2, d3);
}